

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

void * flatcc_builder_finalize_aligned_buffer(flatcc_builder_t *B,size_t *size_out)

{
  void *__ptr;
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  ulong uVar4;
  size_t __alignment;
  ulong __size;
  void *p;
  void *local_28;
  
  sVar2 = (long)B->emit_end - (long)B->emit_start;
  if (size_out != (size_t *)0x0) {
    *size_out = sVar2;
  }
  uVar4 = (ulong)B->min_align;
  __size = -uVar4 & (sVar2 + uVar4) - 1;
  local_28 = (void *)0x0;
  __alignment = 8;
  if (8 < uVar4) {
    __alignment = uVar4;
  }
  iVar1 = posix_memalign(&local_28,__alignment,__size);
  __ptr = local_28;
  if (local_28 == (void *)0x0 || iVar1 == 0) {
    if (local_28 == (void *)0x0) goto LAB_001072b9;
    pvVar3 = flatcc_builder_copy_buffer(B,local_28,__size);
    if (pvVar3 != (void *)0x0) {
      return __ptr;
    }
  }
  free(__ptr);
LAB_001072b9:
  if (size_out != (size_t *)0x0) {
    *size_out = 0;
  }
  return (void *)0x0;
}

Assistant:

void *flatcc_builder_finalize_aligned_buffer(flatcc_builder_t *B, size_t *size_out)
{
    void * buffer;
    size_t align;
    size_t size;

    size = flatcc_builder_get_buffer_size(B);

    if (size_out) {
        *size_out = size;
    }
    align = flatcc_builder_get_buffer_alignment(B);

    size = (size + align - 1) & ~(align - 1);
    buffer = FLATCC_BUILDER_ALIGNED_ALLOC(align, size);

    if (!buffer) {
        goto done;
    }
    if (!flatcc_builder_copy_buffer(B, buffer, size)) {
        FLATCC_BUILDER_ALIGNED_FREE(buffer);
        buffer = 0;
        goto done;
    }
done:
    if (!buffer && size_out) {
        *size_out = 0;
    }
    return buffer;
}